

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O0

vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> * __thiscall
spvtools::opt::analysis::DefUseManager::GetAnnotations
          (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           *__return_storage_ptr__,DefUseManager *this,uint32_t id)

{
  Instruction *def_00;
  anon_class_8_1_a7a482a5 local_58;
  function<void_(spvtools::opt::Instruction_*)> local_50;
  Instruction *local_28;
  Instruction *def;
  DefUseManager *pDStack_18;
  uint32_t id_local;
  DefUseManager *this_local;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *annos;
  
  def._3_1_ = 0;
  def._4_4_ = id;
  pDStack_18 = this;
  this_local = (DefUseManager *)__return_storage_ptr__;
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            (__return_storage_ptr__);
  def_00 = GetDef(this,def._4_4_);
  if (def_00 != (Instruction *)0x0) {
    local_58.annos = __return_storage_ptr__;
    local_28 = def_00;
    std::function<void(spvtools::opt::Instruction*)>::
    function<spvtools::opt::analysis::DefUseManager::GetAnnotations(unsigned_int)const::__0,void>
              ((function<void(spvtools::opt::Instruction*)> *)&local_50,&local_58);
    ForEachUser(this,def_00,&local_50);
    std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Instruction*> DefUseManager::GetAnnotations(uint32_t id) const {
  std::vector<Instruction*> annos;
  const Instruction* def = GetDef(id);
  if (!def) return annos;

  ForEachUser(def, [&annos](Instruction* user) {
    if (IsAnnotationInst(user->opcode())) {
      annos.push_back(user);
    }
  });
  return annos;
}